

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int get_request_handler(mg_connection *conn,int handler_type,mg_request_handler *handler,
                       mg_websocket_subprotocols **subprotocols,
                       mg_websocket_connect_handler *connect_handler,
                       mg_websocket_ready_handler *ready_handler,
                       mg_websocket_data_handler *data_handler,
                       mg_websocket_close_handler *close_handler,
                       mg_authorization_handler *auth_handler,void **cbdata,
                       mg_handler_info **handler_info)

{
  char *__s;
  int iVar1;
  mg_request_info *pmVar2;
  size_t sVar3;
  ptrdiff_t pVar4;
  bool bVar5;
  int local_64;
  int matched;
  int step;
  mg_handler_info *tmp_rh;
  size_t urilen;
  char *uri;
  mg_request_info *request_info;
  mg_websocket_ready_handler *ready_handler_local;
  mg_websocket_connect_handler *connect_handler_local;
  mg_websocket_subprotocols **subprotocols_local;
  mg_request_handler *handler_local;
  int handler_type_local;
  mg_connection *conn_local;
  
  pmVar2 = mg_get_request_info(conn);
  if (pmVar2 != (mg_request_info *)0x0) {
    __s = pmVar2->local_uri;
    sVar3 = strlen(__s);
    if (((conn == (mg_connection *)0x0) || (conn->phys_ctx == (mg_context *)0x0)) ||
       (conn->dom_ctx == (mg_domain_context *)0x0)) {
      return 0;
    }
    mg_lock_context(conn->phys_ctx);
    for (local_64 = 0; local_64 < 3; local_64 = local_64 + 1) {
      for (_matched = conn->dom_ctx->handlers; _matched != (mg_handler_info *)0x0;
          _matched = _matched->next) {
        if (_matched->handler_type == handler_type) {
          if (local_64 == 0) {
            bVar5 = false;
            if (_matched->uri_len == sVar3) {
              iVar1 = strcmp(_matched->uri,__s);
              bVar5 = iVar1 == 0;
            }
          }
          else if (local_64 == 1) {
            bVar5 = false;
            if ((_matched->uri_len < sVar3) && (bVar5 = false, __s[_matched->uri_len] == '/')) {
              iVar1 = memcmp(_matched->uri,__s,_matched->uri_len);
              bVar5 = iVar1 == 0;
            }
          }
          else {
            pVar4 = match_prefix(_matched->uri,_matched->uri_len,__s);
            bVar5 = 0 < pVar4;
          }
          if (bVar5) {
            if (handler_type == 1) {
              *subprotocols = _matched->subprotocols;
              *connect_handler = _matched->connect_handler;
              *ready_handler = _matched->ready_handler;
              *data_handler = _matched->data_handler;
              *close_handler = _matched->close_handler;
            }
            else if (handler_type == 0) {
              if (_matched->removing != 0) {
                local_64 = 2;
                break;
              }
              *handler = _matched->handler;
              _matched->refcount = _matched->refcount + 1;
              *handler_info = _matched;
            }
            else {
              *auth_handler = _matched->auth_handler;
            }
            *cbdata = _matched->cbdata;
            mg_unlock_context(conn->phys_ctx);
            return 1;
          }
        }
      }
    }
    mg_unlock_context(conn->phys_ctx);
  }
  return 0;
}

Assistant:

static int
get_request_handler(struct mg_connection *conn,
                    int handler_type,
                    mg_request_handler *handler,
                    struct mg_websocket_subprotocols **subprotocols,
                    mg_websocket_connect_handler *connect_handler,
                    mg_websocket_ready_handler *ready_handler,
                    mg_websocket_data_handler *data_handler,
                    mg_websocket_close_handler *close_handler,
                    mg_authorization_handler *auth_handler,
                    void **cbdata,
                    struct mg_handler_info **handler_info)
{
	const struct mg_request_info *request_info = mg_get_request_info(conn);
	if (request_info) {
		const char *uri = request_info->local_uri;
		size_t urilen = strlen(uri);
		struct mg_handler_info *tmp_rh;
		int step, matched;

		if (!conn || !conn->phys_ctx || !conn->dom_ctx) {
			return 0;
		}

		mg_lock_context(conn->phys_ctx);

		for (step = 0; step < 3; step++) {
			for (tmp_rh = conn->dom_ctx->handlers; tmp_rh != NULL;
			     tmp_rh = tmp_rh->next) {
				if (tmp_rh->handler_type != handler_type) {
					continue;
				}
				if (step == 0) {
					/* first try for an exact match */
					matched = (tmp_rh->uri_len == urilen)
					          && (strcmp(tmp_rh->uri, uri) == 0);
				} else if (step == 1) {
					/* next try for a partial match, we will accept
					uri/something */
					matched =
					    (tmp_rh->uri_len < urilen)
					    && (uri[tmp_rh->uri_len] == '/')
					    && (memcmp(tmp_rh->uri, uri, tmp_rh->uri_len) == 0);
				} else {
					/* finally try for pattern match */
					matched =
					    match_prefix(tmp_rh->uri, tmp_rh->uri_len, uri) > 0;
				}
				if (matched) {
					if (handler_type == WEBSOCKET_HANDLER) {
						*subprotocols = tmp_rh->subprotocols;
						*connect_handler = tmp_rh->connect_handler;
						*ready_handler = tmp_rh->ready_handler;
						*data_handler = tmp_rh->data_handler;
						*close_handler = tmp_rh->close_handler;
					} else if (handler_type == REQUEST_HANDLER) {
						if (tmp_rh->removing) {
							/* Treat as none found */
							step = 2;
							break;
						}
						*handler = tmp_rh->handler;
						/* Acquire handler and give it back */
						tmp_rh->refcount++;
						*handler_info = tmp_rh;
					} else { /* AUTH_HANDLER */
						*auth_handler = tmp_rh->auth_handler;
					}
					*cbdata = tmp_rh->cbdata;
					mg_unlock_context(conn->phys_ctx);
					return 1;
				}
			}
		}

		mg_unlock_context(conn->phys_ctx);
	}
	return 0; /* none found */
}